

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_compute.cpp
# Opt level: O0

void create_command_pool(Init *init,Data *data)

{
  undefined1 local_70 [8];
  VkCommandBufferAllocateInfo allocate_info;
  undefined1 local_30 [8];
  VkCommandPoolCreateInfo pool_info;
  Data *data_local;
  Init *init_local;
  
  pool_info._16_8_ = data;
  memset(local_30,0,0x18);
  local_30._0_4_ = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  vkb::Device::get_queue_index((Result<unsigned_int> *)&allocate_info.level,&init->device,graphics);
  pool_info.pNext._4_4_ =
       vkb::Result<unsigned_int>::value((Result<unsigned_int> *)&allocate_info.level);
  vkb::Result<unsigned_int>::~Result((Result<unsigned_int> *)&allocate_info.level);
  vkb::DispatchTable::createCommandPool
            (&init->disp,(VkCommandPoolCreateInfo *)local_30,(VkAllocationCallbacks *)0x0,
             (VkCommandPool *)(pool_info._16_8_ + 0x18));
  memset(local_70,0,0x20);
  local_70._0_4_ = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  allocate_info.pNext = *(void **)(pool_info._16_8_ + 0x18);
  allocate_info.commandPool._0_4_ = 0;
  allocate_info.commandPool._4_4_ = 1;
  vkb::DispatchTable::allocateCommandBuffers
            (&init->disp,(VkCommandBufferAllocateInfo *)local_70,
             (VkCommandBuffer *)(pool_info._16_8_ + 0x20));
  return;
}

Assistant:

void create_command_pool(Init& init, Data& data) {
    VkCommandPoolCreateInfo pool_info = {};
    pool_info.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
    pool_info.queueFamilyIndex = init.device.get_queue_index(vkb::QueueType::graphics).value();
    init.disp.createCommandPool(&pool_info, nullptr, &data.command_pool);

    VkCommandBufferAllocateInfo allocate_info = {};
    allocate_info.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
    allocate_info.commandPool = data.command_pool;
    allocate_info.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
    allocate_info.commandBufferCount = 1;
    init.disp.allocateCommandBuffers(&allocate_info, &data.command_buffer);
}